

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool,false,false>
               (hugeint_t *ldata,hugeint_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  idx_t idx;
  int64_t iVar1;
  hugeint_t right;
  hugeint_t right_00;
  hugeint_t right_01;
  hugeint_t left;
  hugeint_t left_00;
  hugeint_t left_01;
  bool bVar2;
  undefined8 *puVar3;
  idx_t *piVar4;
  int64_t *piVar5;
  ValidityMask *in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  byte in_R9B;
  hugeint_t rentry_2;
  hugeint_t lentry_2;
  idx_t i;
  hugeint_t rentry_1;
  hugeint_t lentry_1;
  idx_t start;
  hugeint_t rentry;
  hugeint_t lentry;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  idx_t in_stack_fffffffffffffed0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffed8;
  int64_t in_stack_fffffffffffffee0;
  uint64_t in_stack_fffffffffffffee8;
  int64_t in_stack_fffffffffffffef0;
  idx_t in_stack_ffffffffffffff00;
  ValidityMask *local_f0;
  idx_t local_a8;
  ValidityMask *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  ValidityMask *local_58;
  unsigned_long local_50;
  ulong local_48;
  ulong local_40;
  ValidityMask *local_38;
  byte local_29;
  TemplatedValidityMask<unsigned_long> *local_28;
  ValidityMask *local_20;
  void *local_18;
  void *local_10;
  void *local_8;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  AssertRestrictFunction
            (in_RDI,(void *)((long)in_RDI + (long)in_RCX * 0x10),in_RDX,
             (void *)((long)in_RDX + (long)in_RCX),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x4d);
  AssertRestrictFunction
            (local_10,(void *)((long)local_10 + (long)local_20 * 0x10),local_18,
             (void *)((long)local_18 + (long)local_20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x50);
  bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(local_28);
  if (bVar2) {
    for (local_f0 = (ValidityMask *)0x0; local_f0 < local_20;
        local_f0 = (ValidityMask *)
                   ((long)&(local_f0->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)
        ) {
      piVar4 = (idx_t *)((long)local_8 + (long)local_f0 * 0x10);
      idx = *piVar4;
      piVar5 = (int64_t *)((long)local_10 + (long)local_f0 * 0x10);
      iVar1 = *piVar5;
      left_01.upper = iVar1;
      left_01.lower = piVar4[1];
      right_01.upper = idx;
      right_01.lower = piVar5[1];
      bVar2 = BinarySingleArgumentOperatorWrapper::
              Operation<bool,duckdb::GreaterThan,duckdb::hugeint_t,duckdb::hugeint_t,bool>
                        (SUB81((ulong)iVar1 >> 0x38,0),left_01,right_01,local_f0,idx);
      *(bool *)((long)local_18 + (long)local_f0) = bVar2;
    }
  }
  else {
    local_38 = (ValidityMask *)0x0;
    local_40 = TemplatedValidityMask<unsigned_long>::EntryCount(0x52e81b);
    for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
      local_50 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      local_58 = (ValidityMask *)
                 MinValue<unsigned_long>((unsigned_long)(local_38 + 2),(unsigned_long)local_20);
      bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(local_50);
      if (bVar2) {
        for (; local_38 < local_58;
            local_38 = (ValidityMask *)
                       ((long)&(local_38->super_TemplatedValidityMask<unsigned_long>).validity_mask
                       + 1)) {
          puVar3 = (undefined8 *)((long)local_8 + (long)local_38 * 0x10);
          local_88 = *puVar3;
          local_80 = puVar3[1];
          puVar3 = (undefined8 *)((long)local_10 + (long)local_38 * 0x10);
          local_98 = *puVar3;
          local_90 = puVar3[1];
          left.upper = in_stack_fffffffffffffef0;
          left.lower = in_stack_fffffffffffffee8;
          right.upper = in_stack_fffffffffffffee0;
          right.lower = (uint64_t)in_stack_fffffffffffffed8;
          local_78 = local_98;
          local_70 = local_90;
          local_68 = local_88;
          local_60 = local_80;
          bVar2 = BinarySingleArgumentOperatorWrapper::
                  Operation<bool,duckdb::GreaterThan,duckdb::hugeint_t,duckdb::hugeint_t,bool>
                            (SUB81(in_stack_fffffffffffffed0 >> 0x38,0),left,right,local_38,
                             in_stack_ffffffffffffff00);
          *(bool *)((long)local_18 + (long)local_38) = bVar2;
        }
      }
      else {
        bVar2 = TemplatedValidityMask<unsigned_long>::NoneValid(local_50);
        if (bVar2) {
          local_38 = local_58;
        }
        else {
          local_a0 = local_38;
          for (; local_38 < local_58;
              local_38 = (ValidityMask *)
                         ((long)&(local_38->super_TemplatedValidityMask<unsigned_long>).
                                 validity_mask + 1)) {
            local_a8 = (long)local_38 - (long)local_a0;
            bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid(&local_50,&local_a8);
            if (bVar2) {
              left_00.upper = in_stack_fffffffffffffef0;
              left_00.lower = in_stack_fffffffffffffee8;
              right_00.upper = in_stack_fffffffffffffee0;
              right_00.lower = (uint64_t)in_stack_fffffffffffffed8;
              bVar2 = BinarySingleArgumentOperatorWrapper::
                      Operation<bool,duckdb::GreaterThan,duckdb::hugeint_t,duckdb::hugeint_t,bool>
                                (SUB81(in_stack_fffffffffffffed0 >> 0x38,0),left_00,right_00,
                                 local_38,in_stack_ffffffffffffff00);
              *(bool *)((long)local_18 + (long)local_38) = bVar2;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}